

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O3

void zmDivMont2(word *b,word *divident,word *a,qr_o *r,void *stack)

{
  void *stack_00;
  
  stack_00 = (void *)((long)stack + r->n * 8);
  zmInvMont2((word *)stack,a,r,stack_00);
  zmMulMont2(b,divident,(word *)stack,r,stack_00);
  return;
}

Assistant:

static void zmDivMont2(word b[], const word divident[], const word a[],
	const qr_o* r, void* stack)
{
	word* c = (word*)stack;
	ASSERT(zmIsOperable(r));
	ASSERT(zmIsIn(divident, r));
	ASSERT(zmIsIn(a, r));
	stack = c + r->n;
	// c <- a^{(-1)} (в кольце Монтгомери)
	zmInvMont2(c, a, r, stack);
	// b <- divident * c
	zmMulMont2(b, divident, c, r, stack);
}